

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O0

void __thiscall Scine::Core::ModuleManager::Impl::load(Impl *this,shared_library *library)

{
  bool bVar1;
  __normal_iterator<std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
  in_RDI;
  bool alreadyLoaded;
  LibraryAndModules lib;
  value_type *in_stack_ffffffffffffff78;
  shared_library *in_stack_ffffffffffffff80;
  LibraryAndModules *this_00;
  __normal_iterator<std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
  __last;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  LibraryAndModules *in_stack_ffffffffffffffc0;
  shared_ptr<Scine::Core::Module> local_38;
  LibraryAndModules local_28;
  
  __last._M_current = &local_38;
  boost::dll::shared_library::shared_library
            (in_stack_ffffffffffffff80,&in_stack_ffffffffffffff78->library);
  LibraryAndModules::LibraryAndModules
            (in_stack_ffffffffffffffc0,
             (shared_library *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  boost::dll::shared_library::~shared_library((shared_library *)0x1284cb);
  this_00 = &local_28;
  std::
  begin<std::vector<std::shared_ptr<Scine::Core::Module>,std::allocator<std::shared_ptr<Scine::Core::Module>>>>
            ((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
              *)in_stack_ffffffffffffff78);
  std::
  end<std::vector<std::shared_ptr<Scine::Core::Module>,std::allocator<std::shared_ptr<Scine::Core::Module>>>>
            ((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
              *)in_stack_ffffffffffffff78);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<Scine::Core::Module>*,std::vector<std::shared_ptr<Scine::Core::Module>,std::allocator<std::shared_ptr<Scine::Core::Module>>>>,Scine::Core::ModuleManager::Impl::load(boost::dll::shared_library)::_lambda(auto:1_const&)_1_>
                    (in_RDI,__last,(anon_class_8_1_8991fb9c_for__M_pred)in_RDI._M_current);
  if (!bVar1) {
    std::
    vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
    ::push_back((vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                 *)this_00,in_stack_ffffffffffffff78);
  }
  LibraryAndModules::~LibraryAndModules(this_00);
  return;
}

Assistant:

void load(boost::dll::shared_library library) {
    LibraryAndModules lib{std::move(library)};

    const bool alreadyLoaded = std::any_of(std::begin(lib.modules), std::end(lib.modules),
                                           [&](const auto& modulePtr) -> bool { return moduleLoaded(modulePtr->name()); });

    if (!alreadyLoaded) {
      _sources.push_back(std::move(lib));
    }
  }